

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_service_async_client(t_java_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  ulong uVar2;
  long lVar3;
  t_function *tfunction;
  pointer pcVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  undefined8 uVar12;
  t_java_generator *this_00;
  char *pcVar13;
  t_type *ptVar14;
  pointer pptVar15;
  string funclassname;
  string funname;
  string sep;
  string args_name;
  string javaname;
  string result_name;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_client;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  long *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  t_struct *local_1e0;
  string local_1d8;
  string local_1b8;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  string local_178;
  char *local_158;
  long local_150;
  char local_148 [16];
  t_type *local_138;
  long local_130;
  t_java_generator *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  undefined1 local_f8 [16];
  char *local_e8;
  t_program *local_e0;
  char local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b0;
  _func_int **local_90;
  _func_int *local_80 [2];
  string local_70;
  _Base_ptr local_50 [4];
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"org.apache.thrift.async.TAsyncClient","");
  local_50[0] = (_Base_ptr)(local_50 + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_178,this,&tservice->extends_->super_t_type,false,false,false,false);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_188 = *plVar9;
      lStack_180 = plVar6[3];
      local_198 = &local_188;
    }
    else {
      local_188 = *plVar9;
      local_198 = (long *)*plVar6;
    }
    local_190 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_198);
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
  }
  os = &this->f_service_;
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"public static class AsyncClient extends ",0x28);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_e8,(long)local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," implements AsyncIface {",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "public static class Factory implements org.apache.thrift.async.TAsyncClientFactory<AsyncClient> {"
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"  private org.apache.thrift.async.TAsyncClientManager clientManager;",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"  private org.apache.thrift.protocol.TProtocolFactory protocolFactory;",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "  public Factory(org.apache.thrift.async.TAsyncClientManager clientManager, org.apache.thrift.protocol.TProtocolFactory protocolFactory) {"
             ,0x8a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    this.clientManager = clientManager;",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    this.protocolFactory = protocolFactory;",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  }",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "  public AsyncClient getAsyncClient(org.apache.thrift.transport.TNonblockingTransport transport) {"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    return new AsyncClient(protocolFactory, clientManager, transport);",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  }",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "public AsyncClient(org.apache.thrift.protocol.TProtocolFactory protocolFactory, org.apache.thrift.async.TAsyncClientManager clientManager, org.apache.thrift.transport.TNonblockingTransport transport) {"
             ,0xc9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"  super(protocolFactory, clientManager, transport);",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_c8,&tservice->functions_)
  ;
  uVar12 = local_c8._M_allocated_capacity;
  do {
    if (uVar12 == local_c8._8_8_) {
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      if ((long *)local_c8._M_allocated_capacity != (long *)0x0) {
        operator_delete((void *)local_c8._M_allocated_capacity);
      }
      if (local_50[0] != (_Base_ptr)(local_50 + 2)) {
        operator_delete(local_50[0]);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      return;
    }
    local_198 = &local_188;
    lVar3 = *(long *)(*(long *)uVar12 + 0x68);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,lVar3,*(long *)(*(long *)uVar12 + 0x70) + lVar3);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_","");
    local_128 = (t_java_generator *)local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,local_198,(long)local_198 + local_190);
    if (this->fullcamel_style_ == true) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_178,0,(char *)local_178._M_string_length,0x378967);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_128,
                 (undefined1 *)
                 ((long)&(local_128->super_t_oop_generator).super_t_generator._vptr_t_generator +
                 local_120));
      as_camel_case(&local_1b8,this_00,&local_70,true);
      std::__cxx11::string::operator=((string *)&local_128,(string *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    local_138 = *(t_type **)(*(long *)uVar12 + 0x60);
    local_1e0 = *(t_struct **)(*(long *)uVar12 + 0x88);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_208 = (long *)uVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_198,(long)local_198 + local_190);
    std::__cxx11::string::append((char *)&local_1b8);
    lVar3 = *local_208;
    local_130 = *(long *)(lVar3 + 0x90);
    local_158 = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,*(long *)(lVar3 + 0x68),
               *(long *)(lVar3 + 0x70) + *(long *)(lVar3 + 0x68));
    std::__cxx11::string::append((char *)&local_158);
    local_108 = local_f8;
    lVar3 = *(long *)(*local_208 + 0x68);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,lVar3,*(long *)(*local_208 + 0x70) + lVar3);
    std::__cxx11::string::append((char *)&local_108);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public ",7);
    tfunction = (t_function *)*local_208;
    local_90 = local_80;
    ptVar14 = (t_type *)&local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)ptVar14,"");
    function_signature_async(&local_268,this,tfunction,false,(string *)ptVar14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," throws org.apache.thrift.TException {",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  checkReady();",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::operator+(&local_248," method_call = new ",&local_1b8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268.field_2._8_8_ = plVar6[3];
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_268._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
    async_argument_list_abi_cxx11_(&local_228,this,(t_function *)*local_208,local_1e0,ptVar14,false)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,", this, ___protocolFactory, ___transport);",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"  this.___currentMethod = method_call;",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"  ___manager.call(method_call);",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::operator+(&local_200,"public static class ",&local_1b8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_228.field_2._M_allocated_capacity = *puVar11;
      local_228.field_2._8_8_ = plVar6[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar11;
      local_228._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_228._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    type_name_abi_cxx11_(&local_1d8,this,*(t_type **)(*local_208 + 0x60),true,false,false,false);
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar12 = local_228.field_2._M_allocated_capacity;
    }
    uVar2 = (long)&((t_doc *)local_228._M_string_length)->_vptr_t_doc + local_1d8._M_string_length;
    ptVar14 = (t_type *)local_228._M_string_length;
    if ((ulong)uVar12 < uVar2) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        uVar12 = local_1d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < uVar2) goto LAB_00262806;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
    }
    else {
LAB_00262806:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1d8._M_dataplus._M_p)
      ;
    }
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_248.field_2._M_allocated_capacity = *psVar10;
      local_248.field_2._8_8_ = puVar8[3];
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar10;
      local_248._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_248._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268.field_2._8_8_ = plVar6[3];
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_268._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar15 = (local_1e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (local_1e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      type_name_abi_cxx11_(&local_1d8,this,(*pptVar15)->type_,false,false,false,false);
      ptVar14 = (t_type *)0x8;
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x39f3d6);
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_200.field_2._M_allocated_capacity = *puVar11;
        local_200.field_2._8_8_ = plVar6[3];
      }
      else {
        local_200.field_2._M_allocated_capacity = *puVar11;
        local_200._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_200._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228.field_2._8_8_ = puVar8[3];
      }
      else {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_228._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_228,(ulong)((*pptVar15)->name_)._M_dataplus._M_p);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_248.field_2._M_allocated_capacity = *psVar10;
        local_248.field_2._8_8_ = puVar8[3];
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar10;
        local_248._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_248._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268.field_2._8_8_ = puVar8[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_268._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
    }
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::operator+(&local_228,"public ",&local_1b8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_248.field_2._M_allocated_capacity = *puVar11;
      local_248.field_2._8_8_ = plVar6[3];
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar11;
      local_248._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_248._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    async_argument_list_abi_cxx11_(&local_200,this,(t_function *)*local_208,local_1e0,ptVar14,true);
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar12 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_200._M_string_length + local_248._M_string_length) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        uVar12 = local_200.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_200._M_string_length + local_248._M_string_length)
      goto LAB_00262cb3;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_200,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_00262cb3:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_200._M_dataplus._M_p)
      ;
    }
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268.field_2._8_8_ = puVar8[3];
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_268._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)psVar10 = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               ", org.apache.thrift.async.TAsyncClient client, org.apache.thrift.protocol.TProtocolFactory protocolFactory, org.apache.thrift.transport.TNonblockingTransport transport) throws org.apache.thrift.TException {"
               ,0xce);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"  super(client, protocolFactory, transport, resultHandler, ",0x3b);
    pcVar13 = "false";
    if ((ulong)*(byte *)(*local_208 + 0x99) != 0) {
      pcVar13 = "true";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,pcVar13,(ulong)*(byte *)(*local_208 + 0x99) ^ 5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    for (pptVar15 = (local_1e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (local_1e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::operator+(&local_200,"  this.",&(*pptVar15)->name_);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228.field_2._8_8_ = puVar8[3];
      }
      else {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_228._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_228,(ulong)((*pptVar15)->name_)._M_dataplus._M_p);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_248.field_2._M_allocated_capacity = *puVar11;
        local_248.field_2._8_8_ = puVar8[3];
      }
      else {
        local_248.field_2._M_allocated_capacity = *puVar11;
        local_248._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_248._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268.field_2._8_8_ = plVar6[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_268._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
    }
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "public void write_args(org.apache.thrift.protocol.TProtocol prot) throws org.apache.thrift.TException {"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"prot.writeMessageBegin(new org.apache.thrift.protocol.TMessage(\"",0x40);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_198,local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\", org.apache.thrift.protocol.",0x1e);
    pcVar13 = "TMessageType.CALL";
    if (*(byte *)(*local_208 + 0x99) != 0) {
      pcVar13 = "TMessageType.ONEWAY";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,pcVar13,(ulong)*(byte *)(*local_208 + 0x99) * 2 + 0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", 0));",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_248._M_dataplus._M_p,local_248._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_158,local_150);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," args = new ",0xc);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_158,local_150);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"();",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    for (pptVar15 = (local_1e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (local_1e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"args.set",8);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar4 = ((*pptVar15)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar4,pcVar4 + ((*pptVar15)->name_)._M_string_length);
      get_cap_name(&local_248,this,&local_b0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                          ((*pptVar15)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
    }
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"args.write(prot);",0x11);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"prot.writeMessageEnd();",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    type_name_abi_cxx11_(&local_228,this,local_138,true,false,false,false);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x398b18);
    plVar6 = local_208;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_248.field_2._M_allocated_capacity = *psVar10;
      local_248.field_2._8_8_ = plVar9[3];
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar10;
      local_248._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_248._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268.field_2._8_8_ = plVar9[3];
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar10;
      local_268._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_268._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    for (plVar9 = *(long **)(local_130 + 0x88); plVar9 != *(long **)(local_130 + 0x90);
        plVar9 = plVar9 + 1) {
      type_name_abi_cxx11_(&local_248,this,*(t_type **)(*plVar9 + 0x60),false,false,false,false);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268.field_2._8_8_ = puVar8[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_268._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,local_268._M_dataplus._M_p,local_268._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,"org.apache.thrift.TException {",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "if (getState() != org.apache.thrift.async.TAsyncMethodCall.State.RESPONSE_READ) {",
               0x51);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"  throw new java.lang.IllegalStateException(\"Method call not finished!\");",
               0x49);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "org.apache.thrift.transport.TMemoryInputTransport memoryTransport = new org.apache.thrift.transport.TMemoryInputTransport(getFrameBuffer().array());"
               ,0x94);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "org.apache.thrift.protocol.TProtocol prot = client.getProtocolFactory().getProtocol(memoryTransport);"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    t_generator::indent((t_generator *)this,(ostream *)os);
    iVar5 = (*(local_138->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar5 == '\0') {
      std::operator+(&local_228,"return (new Client(prot)).recv",&local_178);
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_128);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_248.field_2._M_allocated_capacity = *psVar10;
        local_248.field_2._8_8_ = puVar8[3];
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar10;
        local_248._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_248._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268.field_2._8_8_ = puVar8[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar10;
        local_268._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_268._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_268._M_dataplus._M_p,local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"return null;",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if (local_128 != (t_java_generator *)local_118) {
      operator_delete(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    uVar12 = plVar6 + 1;
  } while( true );
}

Assistant:

void t_java_generator::generate_service_async_client(t_service* tservice) {
  string extends = "org.apache.thrift.async.TAsyncClient";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends()) + ".AsyncClient";
  }

  indent(f_service_) << "public static class AsyncClient extends " << extends
                     << " implements AsyncIface {" << endl;
  indent_up();

  // Factory method
  indent(f_service_) << "public static class Factory implements "
                        "org.apache.thrift.async.TAsyncClientFactory<AsyncClient> {" << endl;
  indent(f_service_) << "  private org.apache.thrift.async.TAsyncClientManager clientManager;"
                     << endl;
  indent(f_service_) << "  private org.apache.thrift.protocol.TProtocolFactory protocolFactory;"
                     << endl;
  indent(f_service_) << "  public Factory(org.apache.thrift.async.TAsyncClientManager "
                        "clientManager, org.apache.thrift.protocol.TProtocolFactory "
                        "protocolFactory) {" << endl;
  indent(f_service_) << "    this.clientManager = clientManager;" << endl;
  indent(f_service_) << "    this.protocolFactory = protocolFactory;" << endl;
  indent(f_service_) << "  }" << endl;
  indent(f_service_) << "  public AsyncClient "
                        "getAsyncClient(org.apache.thrift.transport.TNonblockingTransport "
                        "transport) {" << endl;
  indent(f_service_) << "    return new AsyncClient(protocolFactory, clientManager, transport);"
                     << endl;
  indent(f_service_) << "  }" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public AsyncClient(org.apache.thrift.protocol.TProtocolFactory "
                        "protocolFactory, org.apache.thrift.async.TAsyncClientManager "
                        "clientManager, org.apache.thrift.transport.TNonblockingTransport "
                        "transport) {" << endl;
  indent(f_service_) << "  super(protocolFactory, clientManager, transport);" << endl;
  indent(f_service_) << "}" << endl << endl;

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();
    string sep = "_";
    string javaname = funname;
    if (fullcamel_style_) {
      sep = "";
      javaname = as_camel_case(javaname);
    }
    t_type* ret_type = (*f_iter)->get_returntype();
    t_struct* arg_struct = (*f_iter)->get_arglist();
    string funclassname = funname + "_call";
    const vector<t_field*>& fields = arg_struct->get_members();
    const std::vector<t_field*>& xceptions = (*f_iter)->get_xceptions()->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string args_name = (*f_iter)->get_name() + "_args";
    string result_name = (*f_iter)->get_name() + "_result";

    // Main method body
    indent(f_service_) << "public " << function_signature_async(*f_iter, false)
                       << " throws org.apache.thrift.TException {" << endl;
    indent(f_service_) << "  checkReady();" << endl;
    indent(f_service_) << "  " << funclassname << " method_call = new " + funclassname + "("
                       << async_argument_list(*f_iter, arg_struct, ret_type)
                       << ", this, ___protocolFactory, ___transport);" << endl;
    indent(f_service_) << "  this.___currentMethod = method_call;" << endl;
    indent(f_service_) << "  ___manager.call(method_call);" << endl;
    indent(f_service_) << "}" << endl;

    f_service_ << endl;

    // TAsyncMethod object for this function call
    indent(f_service_) << "public static class " + funclassname
                          + " extends org.apache.thrift.async.TAsyncMethodCall<"
                          + type_name((*f_iter)->get_returntype(), true) + "> {" << endl;
    indent_up();

    // Member variables
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      indent(f_service_) << "private " + type_name((*fld_iter)->get_type()) + " "
                            + (*fld_iter)->get_name() + ";" << endl;
    }

    // NOTE since we use a new Client instance to deserialize, let's keep seqid to 0 for now
    // indent(f_service_) << "private int seqid;" << endl << endl;

    // Constructor
    indent(f_service_) << "public " + funclassname + "("
                          + async_argument_list(*f_iter, arg_struct, ret_type, true)
                       << ", org.apache.thrift.async.TAsyncClient client, "
                          "org.apache.thrift.protocol.TProtocolFactory protocolFactory, "
                          "org.apache.thrift.transport.TNonblockingTransport transport) throws "
                          "org.apache.thrift.TException {" << endl;
    indent(f_service_) << "  super(client, protocolFactory, transport, resultHandler, "
                       << ((*f_iter)->is_oneway() ? "true" : "false") << ");" << endl;

    // Assign member variables
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      indent(f_service_) << "  this." + (*fld_iter)->get_name() + " = " + (*fld_iter)->get_name()
                            + ";" << endl;
    }

    indent(f_service_) << "}" << endl << endl;

    indent(f_service_) << "public void write_args(org.apache.thrift.protocol.TProtocol prot) "
                          "throws org.apache.thrift.TException {" << endl;
    indent_up();

    // Serialize request
    // NOTE we are leaving seqid as 0, for now (see above)
    f_service_ << indent() << "prot.writeMessageBegin(new org.apache.thrift.protocol.TMessage(\""
               << funname << "\", org.apache.thrift.protocol."
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL") << ", 0));"
               << endl << indent() << args_name << " args = new " << args_name << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(prot);" << endl << indent() << "prot.writeMessageEnd();"
               << endl;

    indent_down();
    indent(f_service_) << "}" << endl << endl;

    // Return method
    indent(f_service_) << "public " + type_name(ret_type, true) + " getResult() throws ";
    vector<t_field*>::const_iterator x_iter;
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_ << type_name((*x_iter)->get_type(), false, false) + ", ";
    }
    f_service_ << "org.apache.thrift.TException {" << endl;

    indent_up();
    f_service_
        << indent()
        << "if (getState() != org.apache.thrift.async.TAsyncMethodCall.State.RESPONSE_READ) {"
        << endl << indent() << "  throw new java.lang.IllegalStateException(\"Method call not finished!\");"
        << endl << indent() << "}" << endl << indent()
        << "org.apache.thrift.transport.TMemoryInputTransport memoryTransport = new "
           "org.apache.thrift.transport.TMemoryInputTransport(getFrameBuffer().array());" << endl
        << indent() << "org.apache.thrift.protocol.TProtocol prot = "
                       "client.getProtocolFactory().getProtocol(memoryTransport);" << endl;
    indent(f_service_);
    if (ret_type->is_void()) { // NB: Includes oneways which always return void.
      f_service_ << "return null;" << endl;
    } else {
      f_service_ << "return (new Client(prot)).recv" + sep + javaname + "();" << endl;
    }

    // Close function
    indent_down();
    indent(f_service_) << "}" << endl;

    // Close class
    indent_down();
    indent(f_service_) << "}" << endl << endl;
  }

  // Close AsyncClient
  scope_down(f_service_);
  f_service_ << endl;
}